

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::slashMod(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  ldiv_t lVar3;
  string local_50;
  
  requireDStackDepth(this,2,"/MOD");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  if (uVar1 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/MOD: zero divisor","");
    throwCppExceptionMessage(this,&local_50,errorDivisionByZero);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  lVar3 = ldiv((long)(int)uVar2,(long)(int)uVar1);
  ForthStack<unsigned_int>::setTop(this_00,1,(uint)lVar3.rem);
  ForthStack<unsigned_int>::setTop(this_00,(uint)lVar3.quot);
  return;
}

Assistant:

void slashMod() {
			REQUIRE_DSTACK_DEPTH(2, "/MOD");
			auto n2 = static_cast<SCell>(dStack.getTop());
			auto n1 = static_cast<SCell>(dStack.getTop(1));
			RUNTIME_ERROR_IF(n2 == 0, "/MOD: zero divisor", errorDivisionByZero);
			auto result = std::ldiv(n1, n2);
			dStack.setTop(1, static_cast<Cell>(result.rem));
			dStack.setTop(static_cast<Cell>(result.quot));
		}